

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aria.c
# Opt level: O0

int aria_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  ARIA_KEY *key_00;
  int in_ECX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int unaff_retaddr;
  uchar *in_stack_00000008;
  int mode;
  int ret;
  EVP_CIPHER_CTX *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  int line;
  int in_stack_ffffffffffffffd0;
  int local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  line = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  EVP_CIPHER_CTX_get0_cipher(in_RDI);
  iVar1 = EVP_CIPHER_get_mode((EVP_CIPHER *)0x424109);
  if ((in_ECX == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
    in_stack_ffffffffffffffc4 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 << 3;
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    local_28 = ossl_aria_set_decrypt_key
                         (in_stack_00000008,unaff_retaddr,
                          (ARIA_KEY *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
  }
  else {
    in_stack_ffffffffffffffd0 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 << 3;
    key_00 = (ARIA_KEY *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    local_28 = ossl_aria_set_encrypt_key(in_RSI,in_stack_ffffffffffffffd0,key_00);
    line = (int)((ulong)in_RSI >> 0x20);
  }
  if (-1 >= local_28) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),line,
                  (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ERR_set_error(6,0xb0,(char *)0x0);
  }
  return (uint)(-1 < local_28);
}

Assistant:

static int aria_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                            const unsigned char *iv, int enc)
{
    int ret;
    int mode = EVP_CIPHER_CTX_get_mode(ctx);

    if (enc || (mode != EVP_CIPH_ECB_MODE && mode != EVP_CIPH_CBC_MODE))
        ret = ossl_aria_set_encrypt_key(key,
                                        EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                        EVP_CIPHER_CTX_get_cipher_data(ctx));
    else
        ret = ossl_aria_set_decrypt_key(key,
                                        EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                        EVP_CIPHER_CTX_get_cipher_data(ctx));
    if (ret < 0) {
        ERR_raise(ERR_LIB_EVP,EVP_R_ARIA_KEY_SETUP_FAILED);
        return 0;
    }
    return 1;
}